

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O1

bool __thiscall lr_grammar::GrammarLR::sim(GrammarLR *this,char *testString)

{
  pointer pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  _Elt_pointer psVar6;
  long *plVar7;
  int *piVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  Express *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  stackElem e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string text;
  vector<stackElem,_std::allocator<stackElem>_> elemprint;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ipString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string tmp;
  stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> s;
  string bufS;
  stringstream sstream;
  char buffer [200];
  stackElem local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  long local_4d0;
  stackElem *local_4c8;
  iterator iStack_4c0;
  stackElem *local_4b8;
  long local_4b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  int local_484;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  long local_460;
  ulong local_458;
  long local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  _Deque_base<stackElem,_std::allocator<stackElem>_> local_428;
  long local_3d0;
  GrammarLR *local_3c8;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0 [16];
  string local_2a0;
  long local_280 [2];
  ostream local_270 [16];
  int aiStack_260 [24];
  ios_base local_200 [104];
  long alStack_198 [20];
  char local_f8 [200];
  
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2a0,testString,(allocator *)local_280);
  public_tool::parse_elem(&local_2a0,&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_428._M_impl.super__Deque_impl_data._M_finish._M_last = (stackElem *)0x0;
  local_428._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_428._M_impl.super__Deque_impl_data._M_finish._M_cur = (stackElem *)0x0;
  local_428._M_impl.super__Deque_impl_data._M_finish._M_first = (stackElem *)0x0;
  local_428._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_428._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_428._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_428._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_428._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_428._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<stackElem,_std::allocator<stackElem>_>::_M_initialize_map(&local_428,0);
  local_4c8 = (stackElem *)0x0;
  iStack_4c0._M_current = (stackElem *)0x0;
  local_4b8 = (stackElem *)0x0;
  local_2c0 = local_2b0;
  local_2b8 = 0;
  local_2b0[0] = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_280);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  local_4f0._M_string_length = 0;
  local_4f0.field_2._M_local_buf[0] = '\0';
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"#","");
  local_518.elemKey = find_name(this,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_518 = (stackElem)((ulong)(uint)local_518.elemKey << 0x20);
  if (local_428._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_428._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<stackElem,std::allocator<stackElem>>::_M_push_back_aux<stackElem_const&>
              ((deque<stackElem,std::allocator<stackElem>> *)&local_428,&local_518);
  }
  else {
    *local_428._M_impl.super__Deque_impl_data._M_finish._M_cur = local_518;
    local_428._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_428._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (iStack_4c0._M_current == local_4b8) {
    std::vector<stackElem,std::allocator<stackElem>>::_M_realloc_insert<stackElem_const&>
              ((vector<stackElem,std::allocator<stackElem>> *)&local_4c8,iStack_4c0,&local_518);
  }
  else {
    *iStack_4c0._M_current = local_518;
    iStack_4c0._M_current = iStack_4c0._M_current + 1;
  }
  local_460 = 0;
  uVar4 = 0;
  local_3c8 = this;
  do {
    local_458 = (ulong)uVar4;
    local_4d0 = local_458 << 5;
    do {
      while( true ) {
        paVar11 = &local_510.field_2;
        lVar5 = (long)local_518.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        lVar13 = *(long *)((long)&((local_4a8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_4d0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_320,lVar13,
                   *(long *)((long)&(local_4a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_4d0) + lVar13);
        iVar2 = find_name(this,&local_320);
        bVar15 = true;
        if (*(int *)(*(long *)&pvVar1[lVar5].
                               super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                               ._M_impl.super__Vector_impl_data + (long)iVar2 * 0xc) != 1) {
          lVar5 = (long)local_518.states;
          pvVar1 = (this->action_table).
                   super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          lVar13 = *(long *)((long)&((local_4a8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + local_4d0);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_340,lVar13,
                     *(long *)((long)&(local_4a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + local_4d0) + lVar13);
          iVar2 = find_name(this,&local_340);
          bVar15 = *(int *)(*(long *)&pvVar1[lVar5].
                                      super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                      ._M_impl.super__Vector_impl_data + (long)iVar2 * 0xc) == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        if (!bVar15) {
          lVar5 = (long)local_518.states;
          pvVar1 = (this->action_table).
                   super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = *(long *)((long)&((local_4a8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + local_4d0);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_300,lVar13,
                     *(long *)((long)&(local_4a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + local_4d0) + lVar13);
          iVar2 = find_name(this,&local_300);
          iVar2 = *(int *)(*(long *)&pvVar1[lVar5].
                                     super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                     ._M_impl.super__Vector_impl_data + (long)iVar2 * 0xc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p);
          }
          if (iVar2 == 2) {
            local_510._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_510,local_4f0._M_dataplus._M_p,
                       local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
            std::__cxx11::string::append((char *)&local_510);
          }
          else {
            local_510._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_510,local_4f0._M_dataplus._M_p,
                       local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
            std::__cxx11::string::append((char *)&local_510);
          }
          std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != paVar11) {
            operator_delete(local_510._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_280);
          std::ios_base::~ios_base(local_200);
          if (local_2c0 != local_2b0) {
            operator_delete(local_2c0);
          }
          if (local_4c8 != (stackElem *)0x0) {
            operator_delete(local_4c8);
          }
          std::_Deque_base<stackElem,_std::allocator<stackElem>_>::~_Deque_base(&local_428);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_4a8);
          return iVar2 != 2;
        }
        psVar6 = local_428._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_428._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_428._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar6 = local_428._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_518 = psVar6[-1];
        std::__cxx11::string::_M_replace
                  ((ulong)&local_448,0,(char *)local_448._M_string_length,0x1110d4);
        if (iStack_4c0._M_current != local_4c8) {
          uVar12 = 0;
          do {
            std::operator+(&local_510,&local_448,
                           &(this->elements).
                            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_4c8[uVar12].elemKey].
                            super_Elem.name);
            std::__cxx11::string::operator=((string *)&local_448,(string *)&local_510);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != paVar11) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            std::ios::clear((int)*(undefined8 *)(local_280[0] + -0x18) + (int)local_280);
            std::ostream::operator<<(local_270,local_4c8[uVar12].states);
            lVar13 = *(long *)(local_270 + *(long *)(local_280[0] + -0x18));
            std::__istream_extract((istream *)local_280,local_f8,200);
            if ((((*(int *)((long)aiStack_260 + *(long *)(local_280[0] + -0x18)) == 0) &&
                 (lVar13 - 0xc9U < 0xffffffffffffff38)) &&
                (plVar7 = *(long **)((long)alStack_198 + *(long *)(local_280[0] + -0x18)),
                (ulong)plVar7[3] <= (ulong)plVar7[2])) &&
               (iVar2 = (**(code **)(*plVar7 + 0x48))(), iVar2 == -1)) {
              std::ios::clear((int)&local_518 + (int)*(undefined8 *)(local_280[0] + -0x18) + 0x298);
            }
            local_510._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_510,local_448._M_dataplus._M_p,
                       (char *)(local_448._M_string_length + (long)local_448._M_dataplus._M_p));
            std::__cxx11::string::append((char *)&local_510);
            std::__cxx11::string::operator=((string *)&local_448,(string *)&local_510);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != paVar11) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)((long)iStack_4c0._M_current - (long)local_4c8 >> 3));
        }
        sprintf(local_f8,"%-25s",local_448._M_dataplus._M_p);
        local_510._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_510,local_4f0._M_dataplus._M_p,
                   local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
        std::__cxx11::string::append((char *)&local_510);
        std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != paVar11) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_448,0,(char *)local_448._M_string_length,0x1110d4);
        lVar13 = local_460;
        uVar12 = local_458;
        if (local_458 <
            (ulong)((long)local_4a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_4a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          do {
            std::operator+(&local_510,&local_448,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((local_4a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar13));
            std::__cxx11::string::operator=((string *)&local_448,(string *)&local_510);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != paVar11) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            uVar12 = uVar12 + 1;
            lVar13 = lVar13 + 0x20;
          } while (uVar12 < (ulong)((long)local_4a8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_4a8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        sprintf(local_f8,"%+15s         ",local_448._M_dataplus._M_p);
        local_510._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_510,local_4f0._M_dataplus._M_p,
                   local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
        std::__cxx11::string::append((char *)&local_510);
        this = local_3c8;
        std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != paVar11) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        lVar5 = (long)local_518.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        lVar13 = *(long *)((long)&((local_4a8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_4d0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_360,lVar13,
                   *(long *)((long)&(local_4a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_4d0) + lVar13);
        iVar2 = find_name(this,&local_360);
        iVar2 = *(int *)(*(long *)&pvVar1[lVar5].
                                   super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                   ._M_impl.super__Vector_impl_data + (long)iVar2 * 0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        if (iVar2 != 1) break;
        local_510._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_510,local_4f0._M_dataplus._M_p,
                   local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
        std::__cxx11::string::append((char *)&local_510);
        std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != paVar11) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        lVar5 = (long)local_518.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        lVar13 = *(long *)((long)&((local_4a8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_4d0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_380,lVar13,
                   *(long *)((long)&(local_4a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_4d0) + lVar13);
        iVar3 = find_name(this,&local_380);
        lVar13 = *(long *)&pvVar1[lVar5].
                           super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                           ._M_impl.super__Vector_impl_data;
        iVar2 = *(int *)(lVar13 + 4 + (long)iVar3 * 0xc);
        lVar13 = (long)*(int *)(lVar13 + 8 + (long)iVar3 * 0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
        local_3d0 = (long)iVar2;
        local_450 = local_3d0 * 9;
        std::operator+(&local_480,&local_4f0,
                       &(this->elements).
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_3d0].super_Elem.name);
        local_484 = iVar2;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_480);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_510.field_2._M_allocated_capacity = *psVar10;
          local_510.field_2._8_8_ = plVar7[3];
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        }
        else {
          local_510.field_2._M_allocated_capacity = *psVar10;
          local_510._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_510._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p);
        }
        lVar5 = *(long *)((long)&(((this->elements).
                                   super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->expression_of_set).
                                 super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                 ._M_impl + local_450 * 8);
        local_4b0 = lVar13 * 3;
        lVar14 = local_450;
        if (*(long *)(lVar5 + 8 + lVar13 * 0x18) != *(long *)(lVar5 + lVar13 * 0x18)) {
          this_00 = (Express *)(lVar5 + lVar13 * 0x18);
          uVar12 = 0;
          do {
            piVar8 = base_grammar::Express::operator[](this_00,(int)uVar12);
            if (*piVar8 != -1) {
              piVar8 = base_grammar::Express::operator[]
                                 ((Express *)
                                  (local_4b0 * 8 +
                                  *(long *)((long)&(((this->elements).
                                                                                                          
                                                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  expression_of_set).
                                                  super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                                  ._M_impl + lVar14 * 8)),(int)uVar12);
              std::operator+(&local_510,&local_4f0,
                             &(this->elements).
                              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                              ._M_impl.super__Vector_impl_data._M_start[*piVar8].super_Elem.name);
              std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
              lVar14 = local_450;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != &local_510.field_2) {
                operator_delete(local_510._M_dataplus._M_p);
                lVar14 = local_450;
              }
            }
            uVar12 = uVar12 + 1;
            this_00 = (Express *)
                      (*(long *)((long)&(((this->elements).
                                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        expression_of_set).
                                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                        ._M_impl + lVar14 * 8) + local_4b0 * 8);
          } while (uVar12 < (ulong)((long)(this_00->expression).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                    (long)(this_00->expression).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start >> 2));
        }
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_510,local_4f0._M_dataplus._M_p,
                   local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
        std::__cxx11::string::append((char *)&local_510);
        std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p);
        }
        lVar13 = *(long *)((long)&(((this->elements).
                                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->expression_of_set).
                                  super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                  ._M_impl + lVar14 * 8);
        if (*(long *)(lVar13 + 8 + local_4b0 * 8) != *(long *)(lVar13 + local_4b0 * 8)) {
          uVar12 = 0;
          do {
            if (local_428._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_428._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_428._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_428._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_428._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_428._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_428._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
              local_428._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_428._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
              local_428._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_428._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_428._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_428._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            iStack_4c0._M_current = iStack_4c0._M_current + -1;
            uVar12 = uVar12 + 1;
            lVar13 = *(long *)((long)&(((this->elements).
                                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      expression_of_set).
                                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                      ._M_impl + lVar14 * 8);
          } while (uVar12 < (ulong)(*(long *)(lVar13 + 8 + local_4b0 * 8) -
                                    *(long *)(lVar13 + local_4b0 * 8) >> 2));
        }
        psVar6 = local_428._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_428._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_428._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar6 = local_428._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_518 = psVar6[-1];
        lVar13 = *(long *)&(this->action_table).
                           super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_518.states].
                           super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                           ._M_impl.super__Vector_impl_data;
        if (*(int *)(lVar13 + local_3d0 * 0xc) == 2) {
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_510,local_4f0._M_dataplus._M_p,
                     local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
          std::__cxx11::string::append((char *)&local_510);
          std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p);
          }
        }
        else {
          local_518.elemKey = local_484;
          local_518.states = *(int *)(lVar13 + local_3d0 * 0xc + 4);
          if (local_428._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_428._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<stackElem,std::allocator<stackElem>>::_M_push_back_aux<stackElem_const&>
                      ((deque<stackElem,std::allocator<stackElem>> *)&local_428,&local_518);
          }
          else {
            *local_428._M_impl.super__Deque_impl_data._M_finish._M_cur = local_518;
            local_428._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_428._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          if (iStack_4c0._M_current == local_4b8) {
            std::vector<stackElem,std::allocator<stackElem>>::_M_realloc_insert<stackElem_const&>
                      ((vector<stackElem,std::allocator<stackElem>> *)&local_4c8,iStack_4c0,
                       &local_518);
          }
          else {
            *iStack_4c0._M_current = local_518;
            iStack_4c0._M_current = iStack_4c0._M_current + 1;
          }
        }
      }
    } while (iVar2 != 0);
    local_510._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_510,local_4f0._M_dataplus._M_p,
               local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
    std::__cxx11::string::append((char *)&local_510);
    std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != paVar11) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    lVar5 = (long)local_518.states;
    pvVar1 = (this->action_table).
             super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    lVar13 = *(long *)((long)&((local_4a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_4d0);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,lVar13,
               *(long *)((long)&(local_4a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                        local_4d0) + lVar13);
    iVar2 = find_name(this,&local_3a0);
    iVar2 = *(int *)(*(long *)&pvVar1[lVar5].
                               super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                               ._M_impl.super__Vector_impl_data + 4 + (long)iVar2 * 0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    std::ios::clear((int)*(undefined8 *)(local_280[0] + -0x18) + (int)local_280);
    std::ostream::operator<<(local_270,iVar2);
    lVar13 = *(long *)(local_270 + *(long *)(local_280[0] + -0x18));
    std::__istream_extract((istream *)local_280,local_f8,200);
    if (((*(int *)((long)aiStack_260 + *(long *)(local_280[0] + -0x18)) == 0) &&
        (lVar13 - 0xc9U < 0xffffffffffffff38)) &&
       ((plVar7 = *(long **)((long)alStack_198 + *(long *)(local_280[0] + -0x18)),
        (ulong)plVar7[3] <= (ulong)plVar7[2] &&
        (iVar3 = (**(code **)(*plVar7 + 0x48))(), iVar3 == -1)))) {
      std::ios::clear((int)&local_518 + (int)*(undefined8 *)(local_280[0] + -0x18) + 0x298);
    }
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_480,local_4f0._M_dataplus._M_p,
               local_4f0._M_dataplus._M_p + local_4f0._M_string_length);
    std::__cxx11::string::append((char *)&local_480);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_510.field_2._M_allocated_capacity = *psVar10;
      local_510.field_2._8_8_ = puVar9[3];
      local_510._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_510.field_2._M_allocated_capacity = *psVar10;
      local_510._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_510._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_510);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != paVar11) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p);
    }
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    lVar13 = *(long *)((long)&((local_4a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_4d0);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,lVar13,
               *(long *)((long)&(local_4a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                        local_4d0) + lVar13);
    iVar3 = find_name(this,&local_3c0);
    local_518.elemKey = iVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    local_518.states = iVar2;
    if (local_428._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_428._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<stackElem,std::allocator<stackElem>>::_M_push_back_aux<stackElem_const&>
                ((deque<stackElem,std::allocator<stackElem>> *)&local_428,&local_518);
    }
    else {
      *local_428._M_impl.super__Deque_impl_data._M_finish._M_cur = local_518;
      local_428._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_428._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    if (iStack_4c0._M_current == local_4b8) {
      std::vector<stackElem,std::allocator<stackElem>>::_M_realloc_insert<stackElem_const&>
                ((vector<stackElem,std::allocator<stackElem>> *)&local_4c8,iStack_4c0,&local_518);
    }
    else {
      *iStack_4c0._M_current = local_518;
      iStack_4c0._M_current = iStack_4c0._M_current + 1;
    }
    uVar4 = (int)local_458 + 1;
    local_460 = local_460 + 0x20;
  } while( true );
}

Assistant:

bool  GrammarLR::sim(char* testString){

    bool result = true;
    //不使用testString，出现双字符串无法解释;
    vector<string> ipString;
    public_tool::parse_elem(testString, ipString);

    stack<stackElem> s;//指导栈
    vector<stackElem> elemprint;//输出作用
    char formatS[] = "%-25s";//栈的格式
    char formatC[] = "%+15s         ";//字母格式的格式
    string bufS;
    char buffer[200];		//格式化的辅助
    stringstream sstream;
    string tmp;				//字符串中间
    string text;			//输出的串
    int ipIndex = 0;//ip的指向

    stackElem e;
    e.elemKey = find_name("#");//#是开始字符
    e.states = 0;//0是初态
    s.push(e);
    elemprint.push_back(e);
    ReduceByExpress r;
    int st;
    while (action_table[e.states][find_name(ipString[ipIndex])].type == REDUCE || action_table[e.states][find_name(
            ipString[ipIndex])].type == SMOVE){
        e = s.top();

        //1.输出栈
        tmp = "";
        for (int i = 0; i < elemprint.size(); i++){
            tmp = tmp + elements[elemprint[i].elemKey].name;
            sstream.clear();
            sstream << elemprint[i].states;
            sstream >> buffer;
            tmp = tmp + buffer;
        }
        sprintf(buffer, formatS, tmp.c_str());
        text = text + buffer;
        //2.当前输入
        tmp = "";
        for (int i = ipIndex; i < ipString.size(); i++){
            tmp = tmp + ipString[i];
        }
        sprintf(buffer, formatC, tmp.c_str());
        text = text + buffer;

        switch (action_table[e.states][find_name(ipString[ipIndex])].type)
        {
            //不会出现
            case ERROR: break;

            case REDUCE:
                //归约操作
                //3.进行的动作
                text = text + "REDUCE:";
                //get表达式
                r = action_table[e.states][find_name(ipString[ipIndex])].choose.R;
                text = text + elements[r.elemIndex].name + "->";
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    if (elements[r.elemIndex].expression_of_set[r.expressIndex][i] == -1){ continue; }
                    text = text + elements[elements[r.elemIndex].expression_of_set[r.expressIndex][i]].name;
                }
                text = text + "\n";

                //出栈
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    s.pop();
                    elemprint.pop_back();
                }
                //替换终结符操作
                e = s.top();
                if (action_table[e.states][r.elemIndex].type == ERROR){
                    text = text + "ERROR";
                    break;//跳出swtich
                }
                e.elemKey = r.elemIndex;
                e.states = action_table[e.states][r.elemIndex].choose.state;
                s.push(e);
                elemprint.push_back(e);
                break;
            case SMOVE:
                //3.进行的动作
                text = text + "SMOVE:";
                //get表达式
                st = action_table[e.states][find_name(ipString[ipIndex])].choose.state;
                sstream.clear();
                sstream << st;
                sstream >> buffer;
                text = text + buffer + "\n";

                //入栈就行
                e.elemKey = find_name(ipString[ipIndex]);
                e.states = st;
                s.push(e);
                elemprint.push_back(e);
                ipIndex++;
                break;
                //不会出现
            case ACC: break;
            default:
                break;
        }
    }


    if (action_table[e.states][find_name(ipString[ipIndex])].type == ERROR) {
        result = false;
        text = text + "ERROR\n";
    }
    else
    {
        text = text + "ACC\n";
    }
    cout << text;
    return result;
}